

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O3

Node * __thiscall Parser::parseLocalVarDeclaration(Parser *this)

{
  Token *pTVar1;
  int iVar2;
  TokenType TVar3;
  pointer pTVar4;
  pointer pTVar5;
  bool bVar6;
  Node *pNVar7;
  int iVar8;
  CompilationContext *ctx_;
  Node *list;
  vector<Node_*,_std::allocator<Node_*>_> varKeys;
  vector<Node_*,_std::allocator<Node_*>_> varValues;
  Node *local_b0;
  vector<Node_*,_std::allocator<Node_*>_> local_a8;
  vector<Node_*,_std::allocator<Node_*>_> local_88;
  Token *local_68;
  vector<Node_*,_std::allocator<Node_*>_> local_60;
  vector<Node_*,_std::allocator<Node_*>_> local_48;
  
  local_68 = this->tok;
  local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Node **)0x0;
  local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (Node **)0x0;
  local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Node **)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Node **)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Node **)0x0;
  ctx_ = this->ctx;
  if (ctx_->isError == false) {
    do {
      iVar2 = this->pos;
      pTVar1 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar2;
      if (pTVar1->type == TK_LSQUARE) {
        this->tok = pTVar1;
        this->pos = iVar2 + 1;
        pNVar7 = (Node *)operator_new(0x30);
        CompilationContext::Poolable::Poolable((Poolable *)pNVar7,ctx_);
        pNVar7->tok = pTVar1;
        (pNVar7->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar7->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar7->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pNVar7->nodeType = PNT_LIST_OF_KEYS_ARRAY;
        local_b0 = pNVar7;
        parseListOfVars(this,pNVar7,PNT_VAR_DECLARATOR);
        if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_b0);
        }
        else {
          *local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_b0;
          local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        expect(this,TK_RSQUARE);
      }
      else if (pTVar1->type == TK_LBRACE) {
        this->tok = pTVar1;
        this->pos = iVar2 + 1;
        pNVar7 = (Node *)operator_new(0x30);
        CompilationContext::Poolable::Poolable((Poolable *)pNVar7,ctx_);
        pNVar7->tok = pTVar1;
        (pNVar7->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar7->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar7->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pNVar7->nodeType = PNT_LIST_OF_KEYS_TABLE;
        local_b0 = pNVar7;
        parseListOfVars(this,pNVar7,PNT_VAR_DECLARATOR);
        if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                    ((vector<Node*,std::allocator<Node*>> *)&local_a8,
                     (iterator)
                     local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_b0);
        }
        else {
          *local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_b0;
          local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        expect(this,TK_RBRACE);
      }
      else {
        bVar6 = expect(this,TK_IDENTIFIER);
        if (bVar6) {
          local_b0 = createIdentifierNode(this,this->tok);
          if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
                      ((vector<Node*,std::allocator<Node*>> *)&local_a8,
                       (iterator)
                       local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_b0);
          }
          else {
            *local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_b0;
            local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      if (this->ctx->isError != false) break;
      iVar2 = this->pos;
      pTVar4 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar5 = pTVar4 + iVar2;
      TVar3 = pTVar5->type;
      if (TVar3 == TK_COMMA) {
        this->tok = pTVar5;
        this->pos = iVar2 + 1;
LAB_00110683:
        local_b0 = (Node *)0x0;
        if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
                    ((vector<Node*,std::allocator<Node*>> *)&local_88,
                     (iterator)
                     local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_b0);
        }
        else {
          *local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = (Node *)0x0;
          local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        if (TVar3 != TK_ASSIGN) {
          if ((this->tok->nextEol != false) ||
             ((iVar8 = (int)((ulong)((long)(this->tokens->
                                           super__Vector_base<Token,_std::allocator<Token>_>).
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pTVar4)
                            >> 3),
              SBORROW4(iVar2,iVar8 * -0x55555555) != iVar2 + iVar8 * 0x55555555 < 0 &&
              ((TVar3 == TK_SEMICOLON || (TVar3 == TK_RBRACE)))))) goto LAB_00110683;
          local_b0 = (Node *)0x0;
          if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
                      ((vector<Node*,std::allocator<Node*>> *)&local_88,
                       (iterator)
                       local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_b0);
          }
          else {
            *local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish = (Node *)0x0;
            local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          break;
        }
        this->tok = pTVar5;
        this->pos = iVar2 + 1;
        local_b0 = parseTernaryOp(this);
        if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*>
                    ((vector<Node*,std::allocator<Node*>> *)&local_88,
                     (iterator)
                     local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_b0);
        }
        else {
          *local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_b0;
          local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (this->tok->nextEol == false) {
          iVar2 = this->pos;
          pTVar5 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar8 = (int)((ulong)((long)(this->tokens->
                                      super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pTVar5) >> 3);
          if ((SBORROW4(iVar2,iVar8 * -0x55555555) == iVar2 + iVar8 * 0x55555555 < 0) ||
             ((TVar3 = pTVar5[iVar2].type, TVar3 != TK_RBRACE && (TVar3 != TK_SEMICOLON)))) {
            expect(this,TK_COMMA);
          }
        }
      }
      if (this->tok->type != TK_COMMA) {
        if (this->tok->nextEol != false) break;
        iVar2 = this->pos;
        pTVar5 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8 = (int)((ulong)((long)(this->tokens->super__Vector_base<Token,_std::allocator<Token>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5) >> 3
                     );
        if ((SBORROW4(iVar2,iVar8 * -0x55555555) != iVar2 + iVar8 * 0x55555555 < 0) &&
           ((TVar3 = pTVar5[iVar2].type, TVar3 == TK_RBRACE || (TVar3 == TK_SEMICOLON)))) break;
      }
      ctx_ = this->ctx;
      if (ctx_->isError == true) break;
    } while( true );
  }
  if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    CompilationContext::error
              (this->ctx,0x7c,"expected name of variable",this->tok->line,(uint)this->tok->column);
  }
  else if (this->ctx->isError == false) {
    std::vector<Node_*,_std::allocator<Node_*>_>::vector(&local_48,&local_a8);
    std::vector<Node_*,_std::allocator<Node_*>_>::vector(&local_60,&local_88);
    pNVar7 = createLocalVarDeclarationNode(this,local_68,&local_48,&local_60);
    if (local_60.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    goto LAB_00110799;
  }
  pNVar7 = (Node *)0x0;
LAB_00110799:
  if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (Node **)0x0) {
    operator_delete(local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return pNVar7;
}

Assistant:

Node * parseLocalVarDeclaration()
  {
    Token * tk = tok; // = "local"
    std::vector<Node *> varKeys;
    std::vector<Node *> varValues;
    while (!ctx.isError)
    {
      if (accept(TK_LBRACE))
      {
        Node * list = new Node(ctx, *tok);
        list->nodeType = PNT_LIST_OF_KEYS_TABLE;
        parseListOfVars(list, PNT_VAR_DECLARATOR);
        varKeys.push_back(list);
        expect(TK_RBRACE);
      }
      else if (accept(TK_LSQUARE))
      {
        Node * list = new Node(ctx, *tok);
        list->nodeType = PNT_LIST_OF_KEYS_ARRAY;
        parseListOfVars(list, PNT_VAR_DECLARATOR);
        varKeys.push_back(list);
        expect(TK_RSQUARE);
      }
      else if (expect(TK_IDENTIFIER))
      {
        varKeys.push_back(createIdentifierNode(*tok));
      }

      if (ctx.isError)
        break;

      if (accept(TK_ASSIGN))
      {
        varValues.push_back(parseTernaryOp());
        if (!isEndOfStatement())
          expect(TK_COMMA);
      }
      else if (accept(TK_COMMA) || isEndOfStatement())
      {
        varValues.push_back(nullptr);
      }
      else
      {
        varValues.push_back(nullptr);
        break;
      }

      if (tok->type != TK_COMMA && isEndOfStatement())
        break;
    }

    if (varKeys.empty())
    {
      ctx.error(124, "expected name of variable", tok->line, tok->column);
      return nullptr;
    }
    return ctx.isError ? nullptr : createLocalVarDeclarationNode(*tk, varKeys, varValues);
  }